

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O3

UBool __thiscall
icu_63::TailoredSet::handleCE32(TailoredSet *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  CollationData *this_00;
  uint32_t uVar1;
  uint local_34;
  
  local_34 = ce32;
  if (((~ce32 & 0xc0) != 0) ||
     (local_34 = CollationData::getIndirectCE32(this->data,ce32), local_34 != 0xc0)) {
    if (end <= start) {
      end = start;
    }
    do {
      this_00 = this->baseData;
      uVar1 = CollationData::getCE32(this_00,start);
      uVar1 = CollationData::getFinalCE32(this_00,uVar1);
      if ((((local_34 & 0xc0) == 0xc0) &&
          ((4 < (local_34 & 0xf) || ((0x16U >> (local_34 & 0xf) & 1) == 0)))) ||
         (((~uVar1 & 0xc0) == 0 && ((4 < (uVar1 & 0xf) || ((0x16U >> (uVar1 & 0xf) & 1) == 0)))))) {
        compare(this,start,local_34,uVar1);
      }
      else if (local_34 != uVar1) {
        UnicodeSet::add(this->tailored,start);
      }
      start = start + 1;
    } while (end + 1 != start);
  }
  return this->errorCode < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

UBool
TailoredSet::handleCE32(UChar32 start, UChar32 end, uint32_t ce32) {
    U_ASSERT(ce32 != Collation::FALLBACK_CE32);
    if(Collation::isSpecialCE32(ce32)) {
        ce32 = data->getIndirectCE32(ce32);
        if(ce32 == Collation::FALLBACK_CE32) {
            return U_SUCCESS(errorCode);
        }
    }
    do {
        uint32_t baseCE32 = baseData->getFinalCE32(baseData->getCE32(start));
        // Do not just continue if ce32 == baseCE32 because
        // contractions and expansions in different data objects
        // normally differ even if they have the same data offsets.
        if(Collation::isSelfContainedCE32(ce32) && Collation::isSelfContainedCE32(baseCE32)) {
            // fastpath
            if(ce32 != baseCE32) {
                tailored->add(start);
            }
        } else {
            compare(start, ce32, baseCE32);
        }
    } while(++start <= end);
    return U_SUCCESS(errorCode);
}